

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

string * leftJustify(string *__return_storage_ptr__,string *input,int width)

{
  uint uVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = utf8_text_width(input);
  iVar2 = 0;
  if (0 < (int)(width - uVar1)) {
    iVar2 = width - uVar1;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)iVar2);
  std::operator+(__return_storage_ptr__,input,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string leftJustify (const std::string& input, const int width)
{
  return input + std::string (std::max<int> (width - utf8_text_width (input), 0), ' ');
}